

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall OpenMD::SimpleTypeData<bool>::~SimpleTypeData(SimpleTypeData<bool> *this)

{
  void *in_RDI;
  
  ~SimpleTypeData((SimpleTypeData<bool> *)0x1f0b98);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}